

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mod.c
# Opt level: O0

int BN_mod_lshift(BIGNUM *r,BIGNUM *a,int n,BIGNUM *m,BN_CTX *ctx)

{
  int iVar1;
  int ret;
  BIGNUM *abs_m;
  BIGNUM *local_58;
  BIGNUM *local_38;
  int local_4;
  
  local_38 = (BIGNUM *)0x0;
  iVar1 = BN_nnmod(r,a,m,ctx);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    if (m->neg != 0) {
      local_38 = BN_dup(m);
      if (local_38 == (BIGNUM *)0x0) {
        return 0;
      }
      local_38->neg = 0;
    }
    local_58 = m;
    if (local_38 != (BIGNUM *)0x0) {
      local_58 = local_38;
    }
    local_4 = BN_mod_lshift_quick(r,r,n,local_58);
    BN_free(local_38);
  }
  return local_4;
}

Assistant:

int BN_mod_lshift(BIGNUM *r, const BIGNUM *a, int n, const BIGNUM *m,
                  BN_CTX *ctx)
{
    BIGNUM *abs_m = NULL;
    int ret;

    if (!BN_nnmod(r, a, m, ctx))
        return 0;

    if (m->neg) {
        abs_m = BN_dup(m);
        if (abs_m == NULL)
            return 0;
        abs_m->neg = 0;
    }

    ret = BN_mod_lshift_quick(r, r, n, (abs_m ? abs_m : m));
    bn_check_top(r);

    BN_free(abs_m);
    return ret;
}